

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O3

void gb_tick_envelope(SOUND *snd)

{
  byte bVar1;
  
  if (((snd->envelope_enabled == true) &&
      (bVar1 = snd->envelope_count - 1 & 7, snd->envelope_count = bVar1, bVar1 == 0)) &&
     (snd->envelope_count = snd->envelope_time, snd->envelope_time != '\0')) {
    bVar1 = snd->envelope_direction + snd->envelope_value;
    if (bVar1 < 0x10) {
      snd->envelope_value = bVar1;
      return;
    }
    snd->envelope_enabled = false;
    return;
  }
  return;
}

Assistant:

static void gb_tick_envelope(struct SOUND *snd)
{
	if (snd->envelope_enabled)
	{
		snd->envelope_count = (snd->envelope_count - 1) & 0x07;

		if (snd->envelope_count == 0)
		{
			snd->envelope_count = snd->envelope_time;

			if (snd->envelope_count)
			{
				INT8 new_envelope_value = snd->envelope_value + snd->envelope_direction;

				if (new_envelope_value >= 0 && new_envelope_value <= 15)
				{
					snd->envelope_value = new_envelope_value;
				}
				else
				{
					snd->envelope_enabled = false;
				}
			}
		}
	}
}